

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::scan_frames
          (QTextDocumentPrivate *this,int pos,int charsRemoved,int charsAdded)

{
  char16_t cVar1;
  QTextFrame *f;
  QObject *object;
  QTextFrame *t;
  long in_FS_OFFSET;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextFragmentData>_1 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  f = rootFrame(this);
  clearFrame(f);
  local_48.head = (Header *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFragmentMap<QTextFragmentData>::begin((QFragmentMap<QTextFragmentData> *)&local_48);
  while ((int)puStack_40 != 0 || local_48.head != (Header *)&this->fragments) {
    object = &objectForFormat(this,*(int *)(*(long *)local_48.head + 0x1c +
                                           ((ulong)puStack_40 & 0xffffffff) * 0x20))->super_QObject;
    t = QtPrivate::qobject_cast_helper<QTextFrame*,QObject>(object);
    if (t != (QTextFrame *)0x0) {
      cVar1 = (this->text).d.ptr
              [*(int *)(*(long *)local_48.head + 0x18 + ((ulong)puStack_40 & 0xffffffff) * 0x20)];
      if (cVar1 == L'￼') {
        *(QTextFrame **)(*(long *)&(t->super_QTextObject).field_0x8 + 0x90) = f;
        QList<QTextFrame_*>::append
                  ((QList<QTextFrame_*> *)(*(long *)&(f->super_QTextObject).field_0x8 + 0x98),t);
      }
      else if (cVar1 == L'﷑') {
        f = *(QTextFrame **)(*(long *)&(t->super_QTextObject).field_0x8 + 0x90);
      }
      else if ((cVar1 == L'﷐') && (f != t)) {
        *(QTextFrame **)(*(long *)&(t->super_QTextObject).field_0x8 + 0x90) = f;
        QList<QTextFrame_*>::append
                  ((QList<QTextFrame_*> *)(*(long *)&(f->super_QTextObject).field_0x8 + 0x98),t);
        f = t;
      }
    }
    QFragmentMap<QTextFragmentData>::ConstIterator::operator++((ConstIterator *)&local_48);
  }
  this->framesDirty = false;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::scan_frames(int pos, int charsRemoved, int charsAdded)
{
    // ###### optimize
    Q_UNUSED(pos);
    Q_UNUSED(charsRemoved);
    Q_UNUSED(charsAdded);

    QTextFrame *f = rootFrame();
    clearFrame(f);

    for (FragmentIterator it = begin(); it != end(); ++it) {
        // QTextFormat fmt = formats.format(it->format);
        QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(it->format));
        if (!frame)
            continue;

        Q_ASSERT(it.size() == 1);
        QChar ch = text.at(it->stringPosition);

        if (ch == QTextBeginningOfFrame) {
            if (f != frame) {
                // f == frame happens for tables
                Q_ASSERT(frame->d_func()->fragment_start == it.n || frame->d_func()->fragment_start == 0);
                frame->d_func()->parentFrame = f;
                f->d_func()->childFrames.append(frame);
                f = frame;
            }
        } else if (ch == QTextEndOfFrame) {
            Q_ASSERT(f == frame);
            Q_ASSERT(frame->d_func()->fragment_end == it.n || frame->d_func()->fragment_end == 0);
            f = frame->d_func()->parentFrame;
        } else if (ch == QChar::ObjectReplacementCharacter) {
            Q_ASSERT(f != frame);
            Q_ASSERT(frame->d_func()->fragment_start == it.n || frame->d_func()->fragment_start == 0);
            Q_ASSERT(frame->d_func()->fragment_end == it.n || frame->d_func()->fragment_end == 0);
            frame->d_func()->parentFrame = f;
            f->d_func()->childFrames.append(frame);
        } else {
            Q_ASSERT(false);
        }
    }
    Q_ASSERT(f == rtFrame);
    framesDirty = false;
}